

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fct_clp__is_param(fct_clp_t *clp,char *param)

{
  fct_clp_t *pfVar1;
  long lVar2;
  size_t sVar3;
  char cVar4;
  long lVar5;
  bool bVar6;
  
  if (clp == (fct_clp_t *)0x0) {
    return 0;
  }
  bVar6 = ::clp.param_list.used_itm_num != 0;
  if (bVar6) {
    sVar3 = 0;
    while (pfVar1 = (fct_clp_t *)::clp.param_list.itm_list[sVar3], pfVar1 != clp) {
      if ((pfVar1 != (fct_clp_t *)0x0) &&
         (cVar4 = *(char *)&(pfVar1->clo_list).itm_list, cVar4 == *(char *)&(clp->clo_list).itm_list
         )) {
        lVar5 = 1;
        do {
          if (cVar4 == '\0') goto LAB_00104e39;
          cVar4 = pfVar1->error_msg[lVar5 + -0x30];
          lVar2 = lVar5 + -0x30;
          lVar5 = lVar5 + 1;
        } while (cVar4 == clp->error_msg[lVar2]);
      }
      sVar3 = sVar3 + 1;
      bVar6 = sVar3 != ::clp.param_list.used_itm_num;
      if (!bVar6) break;
    }
  }
LAB_00104e39:
  return (uint)bVar6;
}

Assistant:

static int
fct_clp__is_param(fct_clp_t *clp, char const *param)
{
    if ( clp == NULL || param == NULL )
    {
        return 0;
    }
    FCT_NLIST_FOREACH_BGN(char *, aparam, &(clp->param_list))
    {
        if ( fctstr_eq(aparam, param) )
        {
            return 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return 0;
}